

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vulkan_mock.cpp
# Opt level: O2

void shim_vkGetPhysicalDeviceFeatures2KHR
               (VkPhysicalDevice physicalDevice,VkPhysicalDeviceFeatures2 *pFeatures)

{
  VkStructureType *__src;
  void *pvVar1;
  PhysicalDeviceDetails *pPVar2;
  pointer pvVar3;
  
  pPVar2 = get_physical_device_details(physicalDevice);
  memcpy(&pFeatures->features,&pPVar2->features,0xdc);
  pPVar2 = get_physical_device_details(physicalDevice);
  do {
    pFeatures = (VkPhysicalDeviceFeatures2 *)pFeatures->pNext;
    if (pFeatures == (VkPhysicalDeviceFeatures2 *)0x0) {
      return;
    }
    for (pvVar3 = (pPVar2->features_pNextChain).
                  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pvVar3 != (pPVar2->features_pNextChain).
                  super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pvVar3 = pvVar3 + 1) {
      __src = (VkStructureType *)
              (pvVar3->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
              super__Vector_impl_data._M_start;
      if (*__src == pFeatures->sType) {
        pvVar1 = pFeatures->pNext;
        memcpy(pFeatures,__src,
               (long)(pvVar3->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
                     super__Vector_impl_data._M_finish - (long)__src);
        pFeatures->pNext = pvVar1;
        break;
      }
    }
  } while( true );
}

Assistant:

VKAPI_ATTR void VKAPI_CALL shim_vkGetPhysicalDeviceFeatures2KHR(VkPhysicalDevice physicalDevice, VkPhysicalDeviceFeatures2* pFeatures) {
    pFeatures->features = get_physical_device_details(physicalDevice).features;
    const auto& phys_dev = get_physical_device_details(physicalDevice);
    VkBaseOutStructure* current = static_cast<VkBaseOutStructure*>(pFeatures->pNext);
    while (current) {
        for (const auto& features_pNext : phys_dev.features_pNextChain) {
            VkBaseOutStructure structure_data{};
            memcpy(&structure_data, features_pNext.data(), sizeof(structure_data));
            if (structure_data.sType == current->sType) {
                VkBaseOutStructure* next = static_cast<VkBaseOutStructure*>(current->pNext);
                std::memcpy(static_cast<void*>(current), features_pNext.data(), features_pNext.size());
                // Repair pNext void* since we clobbered it in the memcpy
                current->pNext = next;
                break;
            }
        }
        current = static_cast<VkBaseOutStructure*>(current->pNext);
    }
}